

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::Parser::ParseLoop(Parser *this)

{
  bool bVar1;
  uint uVar2;
  stringpiece_ssize_type sVar3;
  undefined1 local_28 [8];
  StringPiece line;
  Parser *this_local;
  
  line.length_ = (stringpiece_ssize_type)this;
  StringPiece::StringPiece((StringPiece *)local_28);
  do {
    bVar1 = ReadLine(&this->p_,(StringPiece *)local_28);
    if (!bVar1) {
      return true;
    }
    this->line_ = this->line_ + 1;
    RemoveComment((StringPiece *)local_28);
    StringPieceTrimWhitespace((StringPiece *)local_28);
    sVar3 = StringPiece::size((StringPiece *)local_28);
  } while ((sVar3 == 0) ||
          (uVar2 = (*this->line_consumer_->_vptr_LineConsumer[2])
                             (this->line_consumer_,local_28,&this->error_str_), (uVar2 & 1) != 0));
  return false;
}

Assistant:

bool Parser::ParseLoop() {
  StringPiece line;
  while (ReadLine(&p_, &line)) {
    ++line_;
    RemoveComment(&line);
    StringPieceTrimWhitespace(&line);
    if (line.size() == 0) {
      continue;  // Blank line.
    }
    if (!line_consumer_->ConsumeLine(line, &error_str_)) {
      return false;
    }
  }
  return true;
}